

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_insert2(lyd_node *parent,lyd_node **first_sibling,lyd_node **leader,lyd_node *node,
                   lyds_pool *pool)

{
  lyd_node *__dest;
  LY_ERR LVar1;
  rb_node *prVar2;
  lyd_node *local_b8;
  lyd_value_lyds_tree *_lt;
  undefined1 local_98 [4];
  LY_ERR ret___2;
  undefined4 local_70;
  undefined4 local_6c;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_meta *root_meta;
  lyd_node *next;
  lyd_node *ld;
  rb_node *rbn;
  rb_node *rbt;
  lyds_pool *plStack_38;
  LY_ERR ret;
  lyds_pool *pool_local;
  lyd_node *node_local;
  lyd_node **leader_local;
  lyd_node **first_sibling_local;
  lyd_node *parent_local;
  
  rbn = (rb_node *)0x0;
  plStack_38 = pool;
  pool_local = (lyds_pool *)node;
  node_local = (lyd_node *)leader;
  leader_local = first_sibling;
  first_sibling_local = (lyd_node **)parent;
  if ((((pool == (lyds_pool *)0x0) || (pool->rbn == (rb_node *)0x0)) ||
      (first_sibling == (lyd_node **)0x0)) || (node == (lyd_node *)0x0)) {
    __assert_fail("pool && pool->rbn && first_sibling && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x4f0,
                  "LY_ERR lyds_insert2(struct lyd_node *, struct lyd_node **, struct lyd_node **, struct lyd_node *, struct lyds_pool *)"
                 );
  }
  if ((*leader == (lyd_node *)0x0) || ((*leader)->schema != node->schema)) {
    next = (lyd_node *)0x0;
    lyd_find_sibling_schema(*first_sibling,node->schema,&next);
    if (next == (lyd_node *)0x0) {
      lyd_insert_node_ordby_schema
                ((lyd_node *)first_sibling_local,leader_local,(lyd_node *)pool_local);
      *(lyds_pool **)node_local = pool_local;
      goto LAB_0018a30c;
    }
    *(lyd_node **)node_local = next;
  }
  rbn = lyds_get_rb_tree(*(lyd_node **)node_local,(lyd_meta **)&ret___1);
  if (_ret___1 == (lyd_meta *)0x0) {
    _ret___1 = lyds_pool_get_meta(plStack_38);
    if (_ret___1 == (lyd_meta *)0x0) {
      LVar1 = lyds_create_metadata(*(lyd_node **)node_local,(lyd_meta **)&ret___1);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      local_6c = 0;
      rbt._4_4_ = 0;
    }
    else {
      lyd_insert_meta(*(lyd_node **)node_local,_ret___1,'\0');
    }
  }
  if ((rbn == (rb_node *)0x0) &&
     (lyds_additionally_reuse_rb_tree
                (leader_local,(lyd_node **)node_local,_ret___1,&rbn,plStack_38,
                 (lyd_node **)&root_meta), root_meta != (lyd_meta *)0x0)) {
    LVar1 = lyds_additionally_create_rb_nodes
                      (leader_local,(lyd_node **)node_local,_ret___1,&rbn,(lyd_node *)root_meta);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    local_70 = 0;
    rbt._4_4_ = 0;
  }
  if (plStack_38->rbn == (rb_node *)0x0) {
    LVar1 = rb_insert((lyd_node *)pool_local,&rbn,(rb_node **)&ld);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    rbt._4_4_ = 0;
  }
  else {
    __dest = (lyd_node *)plStack_38->rbn;
    ld = __dest;
    memset(local_98,0,0x28);
    memcpy(__dest,local_98,0x28);
    ld->next = (lyd_node *)pool_local;
    rb_insert_node(&rbn,(rb_node *)ld,(ly_bool *)0x0);
    prVar2 = rb_iter_next(&plStack_38->iter_state);
    plStack_38->rbn = prVar2;
  }
  lyds_link_data_node(leader_local,(lyd_node **)node_local,(lyd_node *)pool_local,_ret___1,
                      (rb_node *)ld);
LAB_0018a30c:
  if (rbn != (rb_node *)0x0) {
    (_ret___1->value).field_2.enum_item = (lysc_type_bitenum_item *)rbn;
  }
  lyd_insert_hash((lyd_node *)pool_local);
  if ((pool_local[1].meta)->name == (char *)0x0) {
    local_b8 = (lyd_node *)pool_local;
  }
  else {
    local_b8 = *leader_local;
  }
  *leader_local = local_b8;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyds_insert2(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_node *node, struct lyds_pool *pool)
{
    LY_ERR ret;
    struct rb_node *rbt = NULL, *rbn;
    struct lyd_node *ld, *next;
    struct lyd_meta *root_meta;

    assert(pool && pool->rbn && first_sibling && node);

    if (!*leader || ((*leader)->schema != node->schema)) {
        /* leader has not been visited yet */
        ld = NULL;
        lyd_find_sibling_schema(*first_sibling, node->schema, &ld);
        if (!ld) {
            /* the destination has no (leaf-)list instance yet. */
            lyd_insert_node_ordby_schema(parent, first_sibling, node);
            *leader = node;
            goto cleanup;
        } else {
            /* leader has been found */
            *leader = ld;
        }
    }

    /* get Red-black tree from leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);
    if (!root_meta) {
        /* leader needs metadata */
        root_meta = lyds_pool_get_meta(pool);
        if (!root_meta) {
            /* there is no free structure for metadata, a new one must be allocated */
            ret = lyds_create_metadata(*leader, &root_meta);
            LY_CHECK_RET(ret);
        } else {
            /* reuse metadata */
            lyd_insert_meta(*leader, root_meta, 0);
        }
    }
    if (!rbt) {
        /* Red-black tree needed */
        lyds_additionally_reuse_rb_tree(first_sibling, leader, root_meta, &rbt, pool, &next);
        if (next) {
            /* there is no free structure for red-black node, a new ones must be allocated */
            ret = lyds_additionally_create_rb_nodes(first_sibling, leader, root_meta, &rbt, next);
            LY_CHECK_RET(ret);
        }
    }

    /* insert @p node */
    if (pool->rbn) {
        /* reuse free red-black node and insert */
        rbn = pool->rbn;
        RBN_RESET(rbn, node);
        rb_insert_node(&rbt, rbn, NULL);
        /* prepare for the next node */
        pool->rbn = rb_iter_next(&pool->iter_state);
    } else {
        /* allocate new node and insert */
        ret = rb_insert(node, &rbt, &rbn);
        LY_CHECK_RET(ret);
    }
    /* connect @p node with siblings so that the order is maintained */
    lyds_link_data_node(first_sibling, leader, node, root_meta, rbn);

cleanup:
    if (rbt) {
        RBT_SET(root_meta, rbt);
    }
    lyd_insert_hash(node);
    *first_sibling = node->prev->next ? *first_sibling : node;

    return LY_SUCCESS;
}